

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

string * __thiscall
ktx::DiffArray<unsigned_char,8ul>::value_abi_cxx11_
          (string *__return_storage_ptr__,void *this,size_t index,OutputFormat format)

{
  bool bVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_t arrayIndex;
  long lVar3;
  string_view fmt;
  format_string<const_std::__cxx11::basic_string<char>_&,_const_unsigned_char_&> fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  char *local_208;
  undefined8 uStack_200;
  string comma;
  stringstream formattedValue;
  v10 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&formattedValue);
  pcVar2 = " ";
  if (format == json_mini) {
    pcVar2 = "";
  }
  bVar1 = true;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&comma,"",(allocator<char> *)&local_208);
    }
    else {
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x3;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_208;
      local_208 = pcVar2;
      ::fmt::v10::vformat_abi_cxx11_(&comma,(v10 *)0x1cdd3e,fmt,args);
    }
    fmt_00.str_.size_ = (size_t)&comma;
    fmt_00.str_.data_ = (char *)0x4;
    ::fmt::v10::print<std::__cxx11::string_const&,unsigned_char_const&>
              (local_1a8,(ostream *)0x1e185e,fmt_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)this + lVar3 + index * 9 + 0x28),(uchar *)in_R9.values_);
    std::__cxx11::string::~string((string *)&comma);
    bVar1 = false;
  }
  if (format == text) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&comma);
    if (comma._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[]",(allocator<char> *)&comma);
    }
    else {
      std::__cxx11::stringbuf::str();
      comma.field_2._M_allocated_capacity = (size_type)local_208;
      comma.field_2._8_8_ = uStack_200;
      fmt_01.size_ = 0xcdc;
      fmt_01.data_ = (char *)0x8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&comma;
      comma._M_dataplus._M_p = pcVar2;
      ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)"[{}{}{}]",fmt_01,args_00);
      std::__cxx11::string::~string((string *)&local_208);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&formattedValue);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        const auto space = format != OutputFormat::json_mini ?  " " : "";

        std::stringstream formattedValue;
        bool first = true;
        for (std::size_t arrayIndex = 0; arrayIndex < N; ++arrayIndex) {
            const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
            fmt::print(formattedValue, "{}{}", comma, DiffBase<std::array<T, N>>::rawValue(index)[arrayIndex]);
        }

        if (format == OutputFormat::text) {
            return formattedValue.str();
        } else {
            if (formattedValue.str().empty()) {
                return "[]";
            } else {
                return fmt::format("[{}{}{}]", space, formattedValue.str(), space);
            }
        }
    }